

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunLegalizeArrayValues(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SynBase *pSVar1;
  uint uVar2;
  VmFunction *pVVar3;
  VmBlock *pVVar4;
  TypeBase *pTVar5;
  TypeArray *pTVar6;
  TypeBase *type;
  VmConstant *address_00;
  VmValue **ppVVar7;
  VmInstruction *pVVar8;
  VmValue *node;
  VmInstruction *loadInst;
  VmValue *load;
  VmInstruction *elementInst;
  VmValue *element;
  uint i;
  VmConstant *address;
  TypeBase *elementType;
  TypeArray *typeArray;
  VmInstruction *next;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar3 = getType<VmFunction>(value);
  if (pVVar3 == (VmFunction *)0x0) {
    pVVar4 = getType<VmBlock>(value);
    if (pVVar4 != (VmBlock *)0x0) {
      module->currentBlock = pVVar4;
      next = pVVar4->firstInstruction;
      while (next != (VmInstruction *)0x0) {
        typeArray = (TypeArray *)next->nextSibling;
        if (next->cmd == VM_INST_ARRAY) {
          pTVar5 = GetBaseType(ctx,(next->super_VmValue).type);
          pTVar6 = getType<TypeArray>(pTVar5);
          pTVar5 = pTVar6->subType;
          pVVar4->insertPoint = next;
          pSVar1 = (next->super_VmValue).source;
          type = GetBaseType(ctx,(next->super_VmValue).type);
          address_00 = anon_unknown.dwarf_1a3010::CreateAlloca(ctx,module,pSVar1,type,"array",true);
          FinalizeAlloca(ctx,module,address_00->container);
          for (element._4_4_ = 0; uVar2 = SmallArray<VmValue_*,_4U>::size(&next->arguments),
              element._4_4_ < uVar2; element._4_4_ = element._4_4_ + 1) {
            ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&next->arguments,element._4_4_);
            elementInst = (VmInstruction *)*ppVVar7;
            pVVar8 = getType<VmInstruction>((VmValue *)elementInst);
            if ((pVVar8 != (VmInstruction *)0x0) && (pVVar8->cmd == VM_INST_DOUBLE_TO_FLOAT)) {
              ppVVar7 = SmallArray<VmValue_*,_4U>::operator[](&pVVar8->arguments,0);
              elementInst = (VmInstruction *)*ppVVar7;
            }
            anon_unknown.dwarf_1a3010::CreateStore
                      (ctx,module,(next->super_VmValue).source,pTVar5,&address_00->super_VmValue,
                       &elementInst->super_VmValue,(int)pTVar5->size * element._4_4_);
          }
          pSVar1 = (next->super_VmValue).source;
          pTVar5 = GetBaseType(ctx,(next->super_VmValue).type);
          node = anon_unknown.dwarf_1a3010::CreateLoad
                           (ctx,module,pSVar1,pTVar5,&address_00->super_VmValue,0);
          pVVar8 = getType<VmInstruction>(node);
          if (pVVar8 != (VmInstruction *)0x0) {
            typeArray = (TypeArray *)pVVar8;
          }
          anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                    (module,&next->super_VmValue,node,(uint *)0x0);
          pVVar4->insertPoint = pVVar4->lastInstruction;
        }
        next = (VmInstruction *)typeArray;
      }
      module->currentBlock = (VmBlock *)0x0;
    }
  }
  else {
    module->currentFunction = pVVar3;
    for (block = pVVar3->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
      RunLegalizeArrayValues(ctx,module,&block->super_VmValue);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLegalizeArrayValues(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeArrayValues(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_ARRAY)
			{
				TypeArray *typeArray = getType<TypeArray>(GetBaseType(ctx, curr->type));

				TypeBase *elementType = typeArray->subType;

				block->insertPoint = curr;

				VmConstant *address = CreateAlloca(ctx, module, curr->source, GetBaseType(ctx, curr->type), "array", true);

				FinalizeAlloca(ctx, module, address->container);

				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					VmValue *element = curr->arguments[i];

					if(VmInstruction *elementInst = getType<VmInstruction>(element))
					{
						if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
							element = elementInst->arguments[0];
					}

					CreateStore(ctx, module, curr->source, elementType, address, element, unsigned(elementType->size * i));
				}

				VmValue *load = CreateLoad(ctx, module, curr->source, GetBaseType(ctx, curr->type), address, 0);

				if(VmInstruction *loadInst = getType<VmInstruction>(load))
					next = loadInst;

				ReplaceValueUsersWith(module, curr, load, NULL);

				block->insertPoint = block->lastInstruction;
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}